

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

void __thiscall CProficiencies::UpdateProfPoints(CProficiencies *this)

{
  CHAR_DATA *ch;
  char *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string buffer;
  char *local_38 [2];
  char *local_28;
  
  ch = this->ch;
  if (this->pawardedtime + 0xe10 <= (ch->played + current_time) - ch->logon) {
    pcVar1 = get_char_color(ch,"yellow");
    local_28 = END_COLOR(this->ch);
    fmt.size_ = 0xcc;
    fmt.data_ = (char *)0x30;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_38;
    local_38[0] = pcVar1;
    ::fmt::v9::vformat_abi_cxx11_
              (&buffer,(v9 *)"{}You feel ready to study new proficiencies.{}\n\r",fmt,args);
    if (this->pawardedtime == 0) {
      send_to_char("See HELP PROFICIENCY for more information.\n\r",this->ch);
    }
    this->points = this->points + 5;
    send_to_char(buffer._M_dataplus._M_p,this->ch);
    this->pawardedtime = (this->ch->played + current_time) - this->ch->logon;
    std::__cxx11::string::~string((string *)&buffer);
  }
  return;
}

Assistant:

void CProficiencies::UpdateProfPoints()
{
	if (ch->played + (current_time - ch->logon) < pawardedtime + 3600)
		return;

	auto buffer = fmt::format("{}You feel ready to study new proficiencies.{}\n\r", 
		get_char_color(ch,"yellow"), 
		END_COLOR(ch));

	if (pawardedtime == 0)
		send_to_char("See HELP PROFICIENCY for more information.\n\r", ch);

	points += POINTS_PER_HOUR;

	send_to_char(buffer.c_str(), ch);

	pawardedtime = ch->played + (current_time - ch->logon);
}